

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

char * Get_First_Whitespace_Character(char *buf,int blen)

{
  char *pcVar1;
  
  if ((buf == (char *)0x0) || (blen < 0)) {
    __assert_fail("buf && blen>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                  ,0x10f,"char *Get_First_Whitespace_Character(char *, int)");
  }
  pcVar1 = buf;
  if (0 < blen) {
    do {
      if (*pcVar1 == ' ') break;
      pcVar1 = pcVar1 + 1;
    } while (pcVar1 < buf + blen);
  }
  if (pcVar1 != buf + blen) {
    buf = pcVar1;
  }
  return buf;
}

Assistant:

INLINE static char *Get_First_Whitespace_Character(char * buf, int blen)
{
  char *p   = buf;
  char *end = &p[blen];
  
  assert(buf && blen>=0);
  while( (p < end) && !is_blank(*p)) 
    p++;
  return( (p==end) ? buf : p );
}